

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_table.c
# Opt level: O2

void ExampleTable_transfer(ExampleTable *to_example_table,ExampleTable *from_example_table)

{
  wchar_t *pwVar1;
  TableRow *pTVar2;
  int iVar3;
  
  iVar3 = (from_example_table->location).line;
  to_example_table->type = from_example_table->type;
  (to_example_table->location).line = iVar3;
  (to_example_table->location).column = (from_example_table->location).column;
  pwVar1 = from_example_table->keyword;
  to_example_table->id = from_example_table->id;
  to_example_table->keyword = pwVar1;
  from_example_table->id = (wchar_t *)0x0;
  from_example_table->keyword = (wchar_t *)0x0;
  pwVar1 = from_example_table->description;
  to_example_table->name = from_example_table->name;
  to_example_table->description = pwVar1;
  from_example_table->name = (wchar_t *)0x0;
  from_example_table->description = (wchar_t *)0x0;
  pTVar2 = from_example_table->table_header;
  to_example_table->tags = from_example_table->tags;
  to_example_table->table_header = pTVar2;
  from_example_table->tags = (Tags *)0x0;
  from_example_table->table_header = (TableRow *)0x0;
  to_example_table->table_body = from_example_table->table_body;
  from_example_table->table_body = (TableRows *)0x0;
  ExampleTable_delete(from_example_table);
  return;
}

Assistant:

void ExampleTable_transfer(ExampleTable* to_example_table, ExampleTable* from_example_table) {
    to_example_table->type = from_example_table->type;
    to_example_table->location.line = from_example_table->location.line;
    to_example_table->location.column = from_example_table->location.column;
    to_example_table->id = from_example_table->id;
    from_example_table->id = 0;
    to_example_table->keyword = from_example_table->keyword;
    from_example_table->keyword = 0;
    to_example_table->name = from_example_table->name;
    from_example_table->name = 0;
    to_example_table->description = from_example_table->description;
    from_example_table->description = 0;
    to_example_table->tags = from_example_table->tags;
    from_example_table->tags = 0;
    to_example_table->table_header = from_example_table->table_header;
    from_example_table->table_header = 0;
    to_example_table->table_body = from_example_table->table_body;
    from_example_table->table_body = 0;
    ExampleTable_delete(from_example_table);
}